

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeDropTable(Btree *p,int iTable,int *piMoved)

{
  int iVar1;
  int rc;
  int *piMoved_local;
  int iTable_local;
  Btree *p_local;
  
  sqlite3BtreeEnter(p);
  iVar1 = btreeDropTable(p,iTable,piMoved);
  sqlite3BtreeLeave(p);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDropTable(Btree *p, int iTable, int *piMoved){
  int rc;
  sqlite3BtreeEnter(p);
  rc = btreeDropTable(p, iTable, piMoved);
  sqlite3BtreeLeave(p);
  return rc;
}